

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_writer.cxx
# Opt level: O0

void __thiscall xray_re::xr_ini_writer::close_section(xr_ini_writer *this)

{
  size_type sVar1;
  xr_ini_writer *this_local;
  
  xr_writer::w_sf((xr_writer *)this,"\n");
  sVar1 = std::
          stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::size(&this->m_section_stack);
  if (sVar1 == 0) {
    msg("couldn\'t close section, because %s was open","none");
  }
  else {
    std::
    stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::pop(&this->m_section_stack);
  }
  return;
}

Assistant:

void xr_ini_writer::close_section()
{
	w_sf("\n");
	if (m_section_stack.size() > 0)
		m_section_stack.pop();
	else
		msg("couldn't close section, because %s was open", "none");
}